

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.hpp
# Opt level: O0

void __thiscall
deqp::gls::VarSpec::set<4,4>
          (VarSpec *this,Matrix<float,_4,_4> *minValue_,Matrix<float,_4,_4> *maxValue_)

{
  DataType DVar1;
  Matrix<float,_4,_4> *maxValue__local;
  Matrix<float,_4,_4> *minValue__local;
  VarSpec *this_local;
  
  DVar1 = glu::getDataTypeMatrix(4,4);
  this->type = DVar1;
  matToArr<4,4,16>(minValue_,(float (*) [16])&this->minValue);
  matToArr<4,4,16>(maxValue_,(float (*) [16])&this->maxValue);
  return;
}

Assistant:

void set (const tcu::Matrix<float, ValRows, ValCols>& minValue_, const tcu::Matrix<float, ValRows, ValCols>& maxValue_)
	{
		type = glu::getDataTypeMatrix(ValCols, ValRows);
		matToArr(minValue_, minValue.f);
		matToArr(maxValue_, maxValue.f);
	}